

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O0

void __thiscall QAccessibleCache::objectDestroyed(QAccessibleCache *this,QObject *obj)

{
  long lVar1;
  bool bVar2;
  iterator o;
  pair<unsigned_int,_const_QMetaObject_*> *ppVar3;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *in_RDI;
  long in_FS_OFFSET;
  Id id;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *__range1;
  pair<unsigned_int,_const_QMetaObject_*> pair;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 local_50;
  iterator local_30 [2];
  QObject *in_stack_ffffffffffffffe0;
  Id in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::values
            ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(QObject **)in_RDI);
  local_30[0].i = (pair<unsigned_int,_const_QMetaObject_*> *)&DAT_aaaaaaaaaaaaaaaa;
  local_30[0] = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(in_RDI);
  o = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(in_RDI);
  while( true ) {
    bVar2 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator!=(local_30,o);
    if (!bVar2) break;
    ppVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator*(local_30);
    local_50 = (undefined4)*(undefined8 *)ppVar3;
    deleteInterface((QAccessibleCache *)CONCAT44(local_50,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0);
    QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator++(local_30);
  }
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QList
            ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)0x967863);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleCache::objectDestroyed(QObject* obj)
{
    /*
    In some cases we might add a not fully-constructed object to the cache. This might happen with
    for instance QWidget subclasses that are in the construction phase. If updateAccessibility() is
    called in the constructor of QWidget (directly or indirectly), it will end up asking for the
    classname of that widget in order to know which accessibility interface subclass the
    accessibility factory should instantiate and return. However, since that requires a virtual
    call to metaObject(), it will return the metaObject() of QWidget (not for the subclass), and so
    the factory will ultimately return a rather generic QAccessibleWidget instead of a more
    specialized interface. Even though it is a "incomplete" interface it will be put in the cache
    and it will be usable as if the object is a widget. In order for the cache to not just return
    the same generic QAccessibleWidget for that object, we have to check if the cache matches
    the objects QMetaObject. We therefore use a QMultiHash and also store the QMetaObject * in
    the value. We therefore might potentially store several values for the corresponding object
    (in theory one for each level in the class inheritance chain)

    This means that after the object have been fully constructed, we will at some point again query
    for the interface for the same object, but now its metaObject() returns the correct
    QMetaObject, so it won't return the QAccessibleWidget that is associated with the object in the
    cache. Instead it will go to the factory and create the _correct_ specialized interface for the
    object. If that succeeded, it will also put that entry in the cache. We will therefore in those
    cases insert *two* cache entries for the same object (using QMultiHash). They both must live
    until the object is destroyed.

    So when the object is destroyed we might have to delete two entries from the cache.
    */
    for (auto pair : objectToId.values(obj)) {
        QAccessible::Id id = pair.first;
        Q_ASSERT_X(idToInterface.contains(id), "", "QObject with accessible interface deleted, where interface not in cache!");
        deleteInterface(id, obj);
    }
}